

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

bool __thiscall crnlib::crn_comp::compress_internal(crn_comp *this)

{
  uchar *puVar1;
  undefined8 uVar2;
  bool bVar3;
  long lVar4;
  vector<unsigned_short> *pAlpha_endpoint_remap;
  int iVar5;
  vector<unsigned_short> *pColor_endpoint_remap;
  vector<unsigned_short> *pColor_selector_remap;
  vector<unsigned_short> *pAlpha_selector_remap;
  uint *puVar6;
  long lVar7;
  symbol_codec *pCodec;
  ulong uVar8;
  long lVar9;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  symbol_codec local_c8;
  
  bVar3 = alias_images(this);
  if ((bVar3) && (bVar3 = quantize_images(this), bVar3)) {
    vector<unsigned_int>::clear(&(this->m_reference_hist).m_hist);
    lVar4 = 0x1ed0;
    local_f0 = 0x1ef0;
    local_f8 = 0x1f80;
    local_100 = 0x1fa0;
    local_108 = 0x1fc0;
    for (lVar7 = 0x1f10; lVar7 != 0x1f80; lVar7 = lVar7 + 0x38) {
      vector<unsigned_short>::clear
                ((vector<unsigned_short> *)
                 ((long)(this->m_task_pool).m_task_stack.m_stack + lVar4 + -0x10));
      vector<unsigned_int>::clear
                ((vector<unsigned_int> *)
                 ((long)(this->m_task_pool).m_task_stack.m_stack + local_f0 + -0x10));
      static_huffman_data_model::clear
                ((static_huffman_data_model *)
                 ((long)(this->m_task_pool).m_task_stack.m_stack + lVar7 + -0x10));
      vector<unsigned_short>::clear
                ((vector<unsigned_short> *)
                 ((long)(this->m_task_pool).m_task_stack.m_stack + local_f8 + -0x10));
      vector<unsigned_int>::clear
                ((vector<unsigned_int> *)
                 ((long)(this->m_task_pool).m_task_stack.m_stack + local_100 + -0x10));
      static_huffman_data_model::clear
                ((static_huffman_data_model *)
                 ((long)(this->m_task_pool).m_task_stack.m_stack + local_108 + -0x10));
      lVar4 = lVar4 + 0x10;
      local_f0 = local_f0 + 0x10;
      local_f8 = local_f8 + 0x10;
      local_100 = local_100 + 0x10;
      local_108 = local_108 + 0x38;
    }
    if (this->m_has_comp[0] != false) {
      optimize_color(this);
    }
    if (this->m_has_comp[1] == true) {
      optimize_alpha(this);
    }
    for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
      pCodec = &local_c8;
      if (iVar5 == 0) {
        pCodec = (symbol_codec *)0x0;
      }
      puVar6 = &this->m_packed_blocks[0].m_size;
      for (uVar8 = 0; uVar8 < (this->m_levels).m_size; uVar8 = uVar8 + 1) {
        symbol_codec::symbol_codec(&local_c8);
        symbol_codec::start_encoding(&local_c8,0x200000);
        bVar3 = this->m_has_comp[0] != false;
        pColor_endpoint_remap = (vector<unsigned_short> *)0x0;
        if (bVar3) {
          pColor_endpoint_remap = this->m_endpoint_remaping;
        }
        pColor_selector_remap = (vector<unsigned_short> *)0x0;
        if (bVar3) {
          pColor_selector_remap = this->m_selector_remaping;
        }
        bVar3 = this->m_has_comp[1] != false;
        pAlpha_endpoint_remap = (vector<unsigned_short> *)0x0;
        if (bVar3) {
          pAlpha_endpoint_remap = this->m_endpoint_remaping + 1;
        }
        pAlpha_selector_remap = (vector<unsigned_short> *)0x0;
        if (bVar3) {
          pAlpha_selector_remap = this->m_selector_remaping + 1;
        }
        pack_blocks(this,(uint)uVar8,iVar5 == 0 && (uint)uVar8 == 0,pCodec,pColor_endpoint_remap,
                    pColor_selector_remap,pAlpha_endpoint_remap,pAlpha_selector_remap);
        symbol_codec::stop_encoding(&local_c8,false);
        if (iVar5 != 0) {
          puVar1 = ((vector<unsigned_char> *)(puVar6 + -2))->m_p;
          ((vector<unsigned_char> *)(puVar6 + -2))->m_p = local_c8.m_output_buf.m_p;
          uVar2 = *(undefined8 *)puVar6;
          *(undefined8 *)puVar6 = local_c8.m_output_buf._8_8_;
          local_c8.m_output_buf.m_p = puVar1;
          local_c8.m_output_buf._8_8_ = uVar2;
        }
        symbol_codec::~symbol_codec(&local_c8);
        puVar6 = puVar6 + 4;
      }
      if (iVar5 == 0) {
        static_huffman_data_model::init(&this->m_reference_dm,(EVP_PKEY_CTX *)0x1);
        lVar9 = 0x1fc0;
        lVar4 = 0;
        for (lVar7 = 0x1f10; lVar7 != 0x1f80; lVar7 = lVar7 + 0x38) {
          if (*(int *)((long)&this->m_endpoint_index_hist[0].m_hist.m_size + lVar4) != 0) {
            static_huffman_data_model::init
                      ((static_huffman_data_model *)
                       ((long)(this->m_task_pool).m_task_stack.m_stack + lVar7 + -0x10),
                       (EVP_PKEY_CTX *)0x1);
          }
          if (*(int *)((long)&this->m_selector_index_hist[0].m_hist.m_size + lVar4) != 0) {
            static_huffman_data_model::init
                      ((static_huffman_data_model *)
                       ((long)(this->m_task_pool).m_task_stack.m_stack + lVar9 + -0x10),
                       (EVP_PKEY_CTX *)0x1);
          }
          lVar4 = lVar4 + 0x10;
          lVar9 = lVar9 + 0x38;
        }
      }
    }
    bVar3 = pack_data_models(this);
    if (bVar3) {
      create_comp_data(this);
      bVar3 = update_progress(this,0x18,1,1);
      if (bVar3) {
        if (-1 < (int)this->m_pParams->m_flags) {
          return true;
        }
        crnlib_print_mem_stats();
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool crn_comp::compress_internal()
    {
        if (!alias_images())
        {
            return false;
        }
        if (!quantize_images())
        {
            return false;
        }

        m_reference_hist.clear();
        for (uint i = 0; i < 2; i++)
        {
            m_endpoint_remaping[i].clear();
            m_endpoint_index_hist[i].clear();
            m_endpoint_index_dm[i].clear();
            m_selector_remaping[i].clear();
            m_selector_index_hist[i].clear();
            m_selector_index_dm[i].clear();
        }

        if (m_has_comp[cColor])
        {
            optimize_color();
        }

        if (m_has_comp[cAlpha0])
        {
            optimize_alpha();
        }

        for (uint pass = 0; pass < 2; pass++)
        {
            for (uint level = 0; level < m_levels.size(); level++)
            {
                symbol_codec codec;
                codec.start_encoding(2 * 1024 * 1024);

                if (!pack_blocks(
                        level,
                        !pass && !level, pass ? &codec : nullptr,
                        m_has_comp[cColor] ? &m_endpoint_remaping[cColor] : nullptr, m_has_comp[cColor] ? &m_selector_remaping[cColor] : nullptr,
                        m_has_comp[cAlpha0] ? &m_endpoint_remaping[cAlpha0] : nullptr, m_has_comp[cAlpha0] ? &m_selector_remaping[cAlpha0] : nullptr))
                {
                    return false;
                }

                codec.stop_encoding(false);

                if (pass)
                {
                    m_packed_blocks[level].swap(codec.get_encoding_buf());
                }
            }

            if (!pass)
            {
                m_reference_dm.init(true, m_reference_hist, 16);

                for (uint i = 0; i < 2; i++)
                {
                    if (m_endpoint_index_hist[i].size())
                    {
                        m_endpoint_index_dm[i].init(true, m_endpoint_index_hist[i], 16);
                    }

                    if (m_selector_index_hist[i].size())
                    {
                        m_selector_index_dm[i].init(true, m_selector_index_hist[i], 16);
                    }
                }
            }
        }

        if (!pack_data_models())
        {
            return false;
        }

        if (!create_comp_data())
        {
            return false;
        }

        if (!update_progress(24, 1, 1))
        {
            return false;
        }

        if (m_pParams->m_flags & cCRNCompFlagDebugging)
        {
            crnlib_print_mem_stats();
        }

        return true;
    }